

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateCxxModuleInformation(cmExportFileGenerator *this,ostream *os)

{
  pointer pcVar1;
  ostream *poVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string path;
  string cxx_module_dirname;
  string trampoline_path;
  cmGeneratedFileStream ap;
  string local_310;
  long *local_2f0;
  long local_2e8;
  long local_2e0 [2];
  string local_2d0;
  undefined8 local_2b0;
  undefined1 *local_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  long local_260;
  long *local_258;
  undefined8 local_250;
  char *local_248;
  
  (*this->_vptr_cmExportFileGenerator[0x15])(&local_2f0,this);
  if (local_2e8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"# Include C++ module properties\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"include(\"${CMAKE_CURRENT_LIST_DIR}/",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_2f0,local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/cxx-modules.cmake\")\n\n",0x16);
    pcVar1 = (this->MainImportFile)._M_dataplus._M_p;
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,pcVar1,pcVar1 + (this->MainImportFile)._M_string_length);
    cmsys::SystemTools::GetFilenamePath((string *)local_280,&local_310);
    std::__cxx11::string::operator=((string *)&local_310,(string *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
    }
    local_2a8 = local_2a0;
    local_2b0 = 1;
    local_2a0[0] = 0x2f;
    local_280._0_8_ = local_310._M_string_length;
    local_280._8_8_ = local_310._M_dataplus._M_p;
    local_270._M_allocated_capacity = 1;
    local_260 = local_2e8;
    local_258 = local_2f0;
    local_250 = 0x12;
    local_248 = "/cxx-modules.cmake";
    views._M_len = 4;
    views._M_array = (iterator)local_280;
    local_270._8_8_ = local_2a8;
    cmCatViews_abi_cxx11_(&local_2d0,views);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_280,&local_2d0,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_280,true);
    (*this->_vptr_cmExportFileGenerator[0x16])(this,local_280);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateCxxModuleInformation(std::ostream& os)
{
  auto const cxx_module_dirname = this->GetCxxModulesDirectory();
  if (cxx_module_dirname.empty()) {
    return;
  }

  // Write the include.
  os << "# Include C++ module properties\n"
     << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << cxx_module_dirname
     << "/cxx-modules.cmake\")\n\n";

  // Get the path to the file we're going to write.
  std::string path = this->MainImportFile;
  path = cmSystemTools::GetFilenamePath(path);
  auto trampoline_path =
    cmStrCat(path, '/', cxx_module_dirname, "/cxx-modules.cmake");

  // Include all configuration-specific include files.
  cmGeneratedFileStream ap(trampoline_path, true);
  ap.SetCopyIfDifferent(true);

  this->GenerateCxxModuleConfigInformation(ap);
}